

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

bool __thiscall Config::Read(Config *this,string *filename,bool nowarn)

{
  variant *this_00;
  char cVar1;
  bool bVar2;
  int iVar3;
  FILE *__stream;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  mapped_type *this_01;
  variant *this_02;
  allocator<char> local_1101;
  Config *local_1100;
  string line;
  string val;
  string key;
  undefined1 local_1098 [48];
  string local_1068 [48];
  char buf [4096];
  
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  key._M_dataplus._M_p = (pointer)&key.field_2;
  key._M_string_length = 0;
  val._M_dataplus._M_p = (pointer)&val.field_2;
  val._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  key.field_2._M_local_buf[0] = '\0';
  val.field_2._M_local_buf[0] = '\0';
  local_1100 = this;
  std::__cxx11::string::_M_assign((string *)&this->filename);
  __stream = fopen((filename->_M_dataplus)._M_p,"rt");
  if (__stream == (FILE *)0x0) {
    if (!nowarn) {
      bVar2 = false;
      Console::Wrn("Configuration file not found: %s",(filename->_M_dataplus)._M_p);
      goto LAB_00123041;
    }
  }
  else {
    this_00 = (variant *)(local_1098 + 0x20);
    do {
      while( true ) {
        do {
          iVar3 = feof(__stream);
          if (iVar3 != 0) {
            fclose(__stream);
            bVar2 = true;
            goto LAB_00123041;
          }
          pcVar4 = fgets(buf,0x1000,__stream);
          if (pcVar4 == (char *)0x0) {
            std::__cxx11::string::assign((char *)&line);
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>((string *)local_1098,buf,&local_1101)
            ;
            util::trim((string *)this_00,(string *)local_1098);
            std::__cxx11::string::operator=((string *)&line,(string *)this_00);
            std::__cxx11::string::~string((string *)this_00);
            std::__cxx11::string::~string((string *)local_1098);
          }
        } while (((line._M_string_length == 0) || (*line._M_dataplus._M_p == '#')) ||
                (lVar5 = std::__cxx11::string::find((char)&line,0x3d), lVar5 == -1));
        std::__cxx11::string::substr((ulong)local_1098,(ulong)&line);
        util::rtrim((string *)this_00,(string *)local_1098);
        std::__cxx11::string::operator=((string *)&key,(string *)this_00);
        std::__cxx11::string::~string((string *)this_00);
        std::__cxx11::string::~string((string *)local_1098);
        if (lVar5 + 1U < line._M_string_length) {
          std::__cxx11::string::substr((ulong)local_1098,(ulong)&line);
          util::ltrim((string *)this_00,(string *)local_1098);
          std::__cxx11::string::operator=((string *)&val,(string *)this_00);
          std::__cxx11::string::~string((string *)this_00);
          this_02 = (variant *)local_1098;
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)this_00,"",(allocator<char> *)local_1098);
          std::__cxx11::string::operator=((string *)&val,(string *)this_00);
          this_02 = this_00;
        }
        std::__cxx11::string::~string((string *)this_02);
        bVar2 = std::operator==(&key,"REQUIRE");
        if (bVar2) break;
        bVar2 = std::operator==(&key,"INCLUDE");
        if ((bVar2) || (bVar2 = std::operator==(&key,"INCLUDE_NOWARN"), bVar2)) {
          bVar2 = std::operator==(&key,"INCLUDE_NOWARN");
          Read(local_1100,&val,bVar2);
        }
        else {
          while ((uVar6 = std::__cxx11::string::find((char)&val,0x5c), uVar6 != 0xffffffffffffffff
                 && (uVar6 != val._M_string_length))) {
            cVar1 = val._M_dataplus._M_p[uVar6 + 1];
            if (((cVar1 == '\\') || (cVar1 == 'n')) || ((cVar1 == 'r' || (cVar1 == 't')))) {
              std::__cxx11::string::replace((ulong)&val,uVar6,(char *)0x2);
            }
          }
          util::variant::variant(this_00,&val);
          this_01 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)local_1100,&key);
          util::variant::operator=(this_01,this_00);
          std::__cxx11::string::~string(local_1068);
        }
      }
      bVar2 = Read(local_1100,&val,false);
    } while (bVar2);
  }
  bVar2 = false;
LAB_00123041:
  std::__cxx11::string::~string((string *)&val);
  std::__cxx11::string::~string((string *)&key);
  std::__cxx11::string::~string((string *)&line);
  return bVar2;
}

Assistant:

bool Config::Read(const std::string& filename, bool nowarn)
{
	std::FILE *fh;
	char buf[Config::MaxLineLength];
	std::string line;
	std::string key;
	std::string val;
	std::size_t eqloc;

	this->filename = filename;

	fh = std::fopen(filename.c_str(), "rt");
	if (!fh)
	{
		if (!nowarn)
			Console::Wrn("Configuration file not found: %s", filename.c_str());
		return false;
	}

	while (!std::feof(fh))
	{
		if (std::fgets(buf, Config::MaxLineLength, fh))
		{
			line = util::trim(buf);
		}
		else
		{
			line = "";
		}

		if (line.length() < 1)
		{
			continue;
		}

		if (line[0] == '#')
		{
			continue;
		}

		eqloc = line.find('=');

		if (eqloc == std::string::npos)
		{
			continue;
		}

		key = util::rtrim(line.substr(0, eqloc));

		if (line.length() > eqloc+1)
		{
			val = util::ltrim(line.substr(eqloc+1));
		}
		else
		{
			val = std::string("");
		}

		if (key == "REQUIRE")
		{
			if (!this->Read(val))
				return false;
		}
		else if (key == "INCLUDE" || key == "INCLUDE_NOWARN")
		{
			bool nowarn = (key == "INCLUDE_NOWARN");
			this->Read(val, nowarn);
		}
		else
		{
			std::size_t loc = val.find('\\');
			while (loc != std::string::npos && loc != val.length())
			{
				if (val[loc + 1] == 't')
				{
					val.replace(loc, 2, "\t");
				}
				else if (val[loc + 1] == 'r')
				{
					val.replace(loc, 2, "\r");
				}
				else if (val[loc + 1] == 'n')
				{
					val.replace(loc, 2, "\n");
				}
				else if (val[loc + 1] == '\\')
				{
					val.replace(loc, 2, "\\");
				}

				loc = val.find('\\', loc+1);
			}

			this->operator[](key) = static_cast<util::variant>(val);
		}
	}

	std::fclose(fh);
	return true;
}